

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ObjDeleteFanout(Cbs2_Man_t *p,int iObj)

{
  int iVar1;
  
  iVar1 = Abc_Var2Lit(iObj,0);
  Vec_IntWriteEntry(&p->vFanoutN,iVar1,0);
  iVar1 = Abc_Var2Lit(iObj,1);
  Vec_IntWriteEntry(&p->vFanoutN,iVar1,0);
  Vec_IntWriteEntry(&p->vFanout0,iObj,0);
  return;
}

Assistant:

void Cbs2_ObjDeleteFanout( Cbs2_Man_t * p, int iObj )
{
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 0), 0 );
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 1), 0 );
    Vec_IntWriteEntry( &p->vFanout0, iObj, 0 );
}